

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_long_fs.c
# Opt level: O1

int main(void)

{
  int iVar1;
  uchar *puVar2;
  uchar *puVar3;
  test_state state;
  test_state local_b8;
  aec_stream local_58;
  
  local_b8.ibuf_len = 0x100;
  local_b8.buf_len = 0x100;
  local_b8.cbuf_len = 0x200;
  puVar2 = (uchar *)malloc(0x100);
  local_b8.ubuf = puVar2;
  puVar3 = (uchar *)malloc(0x200);
  local_b8.cbuf = puVar3;
  local_b8.obuf = (uchar *)malloc(0x100);
  if ((puVar3 == (uchar *)0x0 || puVar2 == (uchar *)0x0) || local_b8.obuf == (uchar *)0x0) {
    puts("Not enough memory.");
    iVar1 = 99;
  }
  else {
    local_b8.strm = &local_58;
    local_58.bits_per_sample = 0x10;
    local_58.block_size = 0x40;
    local_58.rsi = 1;
    local_58.flags = 8;
    local_b8.codec = encode_decode_large;
    update_state(&local_b8);
    iVar1 = check_long_fs(&local_b8);
    free(local_b8.ubuf);
    free(local_b8.cbuf);
    free(local_b8.obuf);
  }
  return iVar1;
}

Assistant:

int main (void)
{
    int status;
    struct aec_stream strm;
    struct test_state state;

    state.buf_len = state.ibuf_len = BUF_SIZE;
    state.cbuf_len = 2 * BUF_SIZE;

    state.ubuf = (unsigned char *)malloc(state.buf_len);
    state.cbuf = (unsigned char *)malloc(state.cbuf_len);
    state.obuf = (unsigned char *)malloc(state.buf_len);

    if (!state.ubuf || !state.cbuf || !state.obuf) {
        printf("Not enough memory.\n");
        return 99;
    }

    strm.flags = AEC_DATA_PREPROCESS;
    state.strm = &strm;
    strm.bits_per_sample = 16;
    strm.block_size = 64;
    strm.rsi = 1;
    state.codec = encode_decode_large;
    update_state(&state);

    status = check_long_fs(&state);
    if (status)
        goto DESTRUCT;

DESTRUCT:
    free(state.ubuf);
    free(state.cbuf);
    free(state.obuf);

    return status;
}